

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O1

int32 parse_rem(char ***attrib,uint32 *tmat,uint32 *state,uint32 *n_state,uint32 n_read)

{
  uint uVar1;
  uint32 uVar2;
  int32 iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pcVar4 = strtok((char *)0x0," \t");
  mk_attrib_list(pcVar4);
  *attrib = mk_attrib_list::attrib_list;
  pcVar4 = strtok((char *)0x0," \t");
  uVar2 = atoi(pcVar4);
  *tmat = uVar2;
  uVar1 = *n_state;
  uVar5 = (ulong)uVar1;
  uVar7 = 0;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pcVar4 = strtok((char *)0x0," \t");
      uVar7 = uVar6;
      if (pcVar4 == (char *)0x0) break;
      uVar2 = 0xffffffff;
      if (*pcVar4 != 'N') {
        uVar2 = atoi(pcVar4);
      }
      state[uVar6] = uVar2;
      uVar6 = uVar6 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar6);
  }
  if (uVar1 < (uint)uVar7) {
    parse_rem_cold_1();
    iVar3 = -1;
  }
  else {
    *n_state = (uint)uVar7;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int32
parse_rem(const char ***attrib,
	  uint32 *tmat,
	  uint32 *state,
	  uint32 *n_state,
	  uint32 n_read)
{
    unsigned int max_n_state;
    uint32 i;
    char *tok;

    *attrib = mk_attrib_list(strtok(NULL, " \t"));

    *tmat = atoi(strtok(NULL, " \t"));

    max_n_state = *n_state;

    for (i = 0; (i < max_n_state) && (tok = strtok(NULL, " \t")); i++) {
	if (tok[0] != 'N')
	    state[i] = atoi(tok);
	else
	    state[i] = TYING_NON_EMITTING;
    }
    
    if (i <= max_n_state)
	*n_state = i;
    else {
	fflush(stdout);
	fprintf(stderr, "%s(%d): number of states for phone exceeds max, %d at line %d\n",
		__FILE__, __LINE__,
		max_n_state, n_read);
	fflush(stderr);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}